

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall
leveldb::VersionSet::Builder::BySmallestKey::operator()
          (BySmallestKey *this,FileMetaData *f1,FileMetaData *f2)

{
  int iVar1;
  int r;
  FileMetaData *f2_local;
  FileMetaData *f1_local;
  BySmallestKey *this_local;
  
  iVar1 = InternalKeyComparator::Compare(this->internal_comparator,&f1->smallest,&f2->smallest);
  if (iVar1 == 0) {
    this_local._7_1_ = f1->number < f2->number;
  }
  else {
    this_local._7_1_ = iVar1 < 0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(FileMetaData* f1, FileMetaData* f2) const {
      int r = internal_comparator->Compare(f1->smallest, f2->smallest);
      if (r != 0) {
        return (r < 0);
      } else {
        // Break ties by file number
        return (f1->number < f2->number);
      }
    }